

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_DsdFindVarNum(char *pDsd)

{
  char *pcVar1;
  int local_14;
  char *pcStack_10;
  int vMax;
  char *pDsd_local;
  
  local_14 = 0;
  pcStack_10 = pDsd + -1;
  while (pcVar1 = pcStack_10 + 1, pcStack_10[1] != '\0') {
    pcStack_10 = pcVar1;
    if (('`' < *pcVar1) && (*pcVar1 < '{')) {
      local_14 = Abc_MaxInt(local_14,*pcVar1 + -0x61);
    }
  }
  return local_14 + 1;
}

Assistant:

int Dau_DsdFindVarNum( char * pDsd )
{
    int vMax = 0;
    pDsd--;
    while ( *++pDsd )
        if ( *pDsd >= 'a' && *pDsd <= 'z' )
            vMax = Abc_MaxInt( vMax, *pDsd - 'a' );
    return vMax + 1;
}